

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.cc
# Opt level: O0

void google::protobuf::CaptureTestStdout(void)

{
  int v1;
  int v2;
  char *pcVar1;
  LogMessage *pLVar2;
  int *piVar3;
  AlphaNum *in_RCX;
  char *local_100;
  byte local_f1;
  LogMessage local_f0;
  Voidify local_dd;
  int local_dc;
  undefined1 local_d8 [4];
  int fd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  AlphaNum local_88;
  string local_58;
  LogMessage local_28;
  Voidify local_11;
  Nullable<const_char_*> local_10;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue(original_stdout_);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue(-1);
  local_10 = absl::lts_20250127::log_internal::Check_EQImpl(v1,v2,"original_stdout_ == -1");
  if (local_10 != (Nullable<const_char_*>)0x0) {
    pcVar1 = absl::lts_20250127::implicit_cast<char_const*>(local_10);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/testing/googletest.cc"
               ,0x9e,pcVar1);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_28);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [19])"Already capturing.");
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_11,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_28);
  }
  TestTempDir_abi_cxx11_();
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_88,&local_a8);
  absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)local_d8,"/captured_stdout");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_58,(lts_20250127 *)&local_88,(AlphaNum *)local_d8,in_RCX);
  std::__cxx11::string::operator=((string *)stdout_capture_filename__abi_cxx11_,(string *)&local_58)
  ;
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_a8);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  local_dc = open(pcVar1,0xc1,0x1ff);
  local_f1 = 0;
  if (local_dc < 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_f0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/testing/googletest.cc"
               ,0xa4,"fd >= 0");
    local_f1 = 1;
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_f0);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,(char (*) [7])"open: ")
    ;
    piVar3 = __errno_location();
    local_100 = strerror(*piVar3);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<<char_*,_0>(pLVar2,&local_100);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_dd,pLVar2);
  }
  if ((local_f1 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_f0);
  }
  original_stdout_ = dup(1);
  close(1);
  dup2(local_dc,1);
  close(local_dc);
  return;
}

Assistant:

void CaptureTestStdout() {
  ABSL_CHECK_EQ(original_stdout_, -1) << "Already capturing.";

  stdout_capture_filename_ = absl::StrCat(TestTempDir(), "/captured_stdout");

  int fd = open(stdout_capture_filename_.c_str(),
                O_WRONLY | O_CREAT | O_EXCL | O_BINARY, 0777);
  ABSL_CHECK(fd >= 0) << "open: " << strerror(errno);

  original_stdout_ = dup(1);
  close(1);
  dup2(fd, 1);
  close(fd);
}